

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O1

void __thiscall blockfilter_tests::gcsfilter_test::test_method(gcsfilter_test *this)

{
  __node_base _Var1;
  readonly_property<bool> rVar2;
  value_type *__val;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  pair<std::__detail::_Node_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_true>,_bool>
  pVar6;
  Element element2;
  GCSFilter filter;
  ElementSet excluded_elements;
  ElementSet included_elements;
  check_type cVar7;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [16];
  undefined8 local_158;
  char **local_150;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  pointer local_e0;
  pointer local_d0;
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_c8;
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ByteVectorHash::ByteVectorHash((ByteVectorHash *)&local_80);
  local_80._M_buckets = &local_80._M_single_bucket;
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  ByteVectorHash::ByteVectorHash((ByteVectorHash *)&local_c8);
  local_c8._M_buckets = &local_c8._M_single_bucket;
  local_c8._M_bucket_count = 1;
  local_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8._M_element_count = 0;
  local_c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8._M_rehash_policy._M_next_resize = 0;
  local_c8._M_single_bucket = (__node_base_ptr)0x0;
  iVar3 = 0;
  do {
    local_108._0_8_ = 0;
    local_108._8_8_ = 0;
    local_f8._0_1_ = '\0';
    local_f8._1_3_ = 0;
    local_f8._4_4_ = 0;
    local_108._0_8_ = operator_new(0x20);
    local_108._8_8_ = local_108._0_8_ + 0x20;
    *(undefined8 *)(local_108._0_8_ + 0x10) = 0;
    *(undefined8 *)(local_108._0_8_ + 0x18) = 0;
    *(undefined8 *)local_108._0_8_ = 0;
    *(undefined8 *)(local_108._0_8_ + 8) = 0;
    *(char *)local_108._0_8_ = (char)iVar3;
    local_168._0_8_ = &local_80;
    local_f8 = (undefined8 *)local_108._8_8_;
    std::
    _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::vector<unsigned_char,std::allocator<unsigned_char>>,true>>>>
              ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_80,local_108,local_168);
    local_168._0_8_ = (_func_int **)0x0;
    local_168._8_8_ = 0;
    local_158._0_1_ = '\0';
    local_158._1_3_ = 0;
    local_158._4_4_ = 0;
    local_168._0_8_ = operator_new(0x20);
    local_168._8_8_ = local_168._0_8_ + 0x20;
    *(_func_int **)(local_168._0_8_ + 0x10) = (_func_int *)0x0;
    *(_func_int **)(local_168._0_8_ + 0x18) = (_func_int *)0x0;
    *(_func_int **)local_168._0_8_ = (_func_int *)0x0;
    *(_func_int **)(local_168._0_8_ + 8) = (_func_int *)0x0;
    *(char *)(local_168._0_8_ + 1) = (char)iVar3;
    local_158 = (undefined1 *)local_168._8_8_;
    local_140._0_8_ = &local_c8;
    std::
    _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::vector<unsigned_char,std::allocator<unsigned_char>>,true>>>>
              ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_c8,local_168,&local_140);
    if ((_func_int **)local_168._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
    }
    if ((undefined8 *)local_108._0_8_ != (undefined8 *)0x0) {
      operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100);
  local_168._0_8_ = (_func_int **)0x0;
  local_168._8_8_ = 0;
  local_158._0_1_ = '\n';
  local_158 = (undefined1 *)CONCAT44(0x400,(undefined4)local_158);
  GCSFilter::GCSFilter((GCSFilter *)local_108,(Params *)local_168,(ElementSet *)&local_80);
  for (_Var1._M_nxt = local_80._M_before_begin._M_nxt; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    local_118 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_110 = "";
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x24;
    file.m_begin = (iterator)&local_118;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)
         GCSFilter::Match((GCSFilter *)local_108,(Element *)(_Var1._M_nxt + 1));
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_178 = "filter.Match(element)";
    local_170 = "";
    local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
    local_168._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = &local_178;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_180 = "";
    pvVar4 = (iterator)0x1;
    pvVar5 = (iterator)0x0;
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,(lazy_ostream *)local_168,1,0,WARN,_cVar7,(size_t)&local_188,0x24);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    local_168._0_8_ = &local_c8;
    pVar6 = std::
            _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::vector<unsigned_char,std::allocator<unsigned_char>>,true>>>>
                      ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_c8,(Element *)(_Var1._M_nxt + 1),(lazy_ostream *)local_168);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x27;
    file_00.m_begin = (iterator)&local_198;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
               msg_00);
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         GCSFilter::MatchAny((GCSFilter *)local_108,(ElementSet *)&local_c8);
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_178 = "filter.MatchAny(excluded_elements)";
    local_170 = "";
    local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
    local_168._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = &local_178;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_1b0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,(lazy_ostream *)local_168,1,0,WARN,_cVar7,(size_t)&local_1b8,0x27);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    std::
    _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase(&local_c8,
            (_Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>)
            pVar6.first.
            super__Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
            ._M_cur);
  }
  if (local_e0 != (pointer)0x0) {
    operator_delete(local_e0,(long)local_d0 - (long)local_e0);
  }
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_c8);
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gcsfilter_test)
{
    GCSFilter::ElementSet included_elements, excluded_elements;
    for (int i = 0; i < 100; ++i) {
        GCSFilter::Element element1(32);
        element1[0] = i;
        included_elements.insert(std::move(element1));

        GCSFilter::Element element2(32);
        element2[1] = i;
        excluded_elements.insert(std::move(element2));
    }

    GCSFilter filter({0, 0, 10, 1 << 10}, included_elements);
    for (const auto& element : included_elements) {
        BOOST_CHECK(filter.Match(element));

        auto insertion = excluded_elements.insert(element);
        BOOST_CHECK(filter.MatchAny(excluded_elements));
        excluded_elements.erase(insertion.first);
    }
}